

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

SAM_hdr * sam_hdr_new(void)

{
  SAM_hdr *__ptr;
  kh_sam_hdr_t *h;
  kh_m_s2i_t *pkVar1;
  pool_alloc_t *p;
  pool_alloc_t *p_00;
  string_alloc_t *psVar2;
  
  __ptr = (SAM_hdr *)calloc(1,0x498);
  if (__ptr == (SAM_hdr *)0x0) {
    return (SAM_hdr *)0x0;
  }
  h = (kh_sam_hdr_t *)calloc(1,0x28);
  __ptr->h = h;
  if (h == (kh_sam_hdr_t *)0x0) goto LAB_00126b97;
  __ptr->ID_cnt = 1;
  __ptr->ref_count = 1;
  pkVar1 = kh_init_m_s2i();
  __ptr->ref_hash = pkVar1;
  if (pkVar1 == (kh_m_s2i_t *)0x0) {
LAB_00126b6b:
    p_00 = (pool_alloc_t *)0x0;
    p = (pool_alloc_t *)0x0;
  }
  else {
    pkVar1 = kh_init_m_s2i();
    __ptr->rg_hash = pkVar1;
    if (pkVar1 == (kh_m_s2i_t *)0x0) goto LAB_00126b6b;
    pkVar1 = kh_init_m_s2i();
    __ptr->pg_hash = pkVar1;
    if (pkVar1 == (kh_m_s2i_t *)0x0) goto LAB_00126b6b;
    p = pool_create(0x18);
    __ptr->tag_pool = p;
    if (p == (pool_alloc_t *)0x0) goto LAB_00126b6b;
    p_00 = pool_create(0x20);
    __ptr->type_pool = p_00;
    if (p_00 == (pool_alloc_t *)0x0) {
      p_00 = (pool_alloc_t *)0x0;
    }
    else {
      psVar2 = string_pool_create(0x2000);
      __ptr->str_pool = psVar2;
      if (psVar2 != (string_alloc_t *)0x0) {
        return __ptr;
      }
    }
  }
  kh_destroy_sam_hdr(h);
  if (p != (pool_alloc_t *)0x0) {
    pool_destroy(p);
    p_00 = __ptr->type_pool;
  }
  if (p_00 != (pool_alloc_t *)0x0) {
    pool_destroy(p_00);
  }
LAB_00126b97:
  if (__ptr->str_pool != (string_alloc_t *)0x0) {
    string_pool_destroy(__ptr->str_pool);
  }
  free(__ptr);
  return (SAM_hdr *)0x0;
}

Assistant:

SAM_hdr *sam_hdr_new() {
    SAM_hdr *sh = calloc(1, sizeof(*sh));

    if (!sh)
	return NULL;
    
    sh->h = kh_init(sam_hdr);
    if (!sh->h)
	goto err;

    sh->ID_cnt = 1;
    sh->ref_count = 1;

    sh->nref = 0;
    sh->ref  = NULL;
    if (!(sh->ref_hash = kh_init(m_s2i)))
	goto err;

    sh->nrg = 0;
    sh->rg  = NULL;
    if (!(sh->rg_hash = kh_init(m_s2i)))
	goto err;

    sh->npg = 0;
    sh->pg  = NULL;
    sh->npg_end = sh->npg_end_alloc = 0;
    sh->pg_end = NULL;
    if (!(sh->pg_hash = kh_init(m_s2i)))
	goto err;

    KS_INIT(&sh->text);

    if (!(sh->tag_pool = pool_create(sizeof(SAM_hdr_tag))))
	goto err;

    if (!(sh->type_pool = pool_create(sizeof(SAM_hdr_type))))
	goto err;

    if (!(sh->str_pool = string_pool_create(8192)))
	goto err;

    return sh;

 err:
    if (sh->h)
	kh_destroy(sam_hdr, sh->h);

    if (sh->tag_pool)
	pool_destroy(sh->tag_pool);

    if (sh->type_pool)
	pool_destroy(sh->type_pool);

    if (sh->str_pool)
	string_pool_destroy(sh->str_pool);

    free(sh);

    return NULL;
}